

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void menu_draw_proc(Am_Object *menu,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int w;
  int h;
  Am_Value *pAVar4;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar6;
  undefined8 uVar5;
  Am_Object local_88;
  undefined1 local_80 [8];
  Am_Draw_Method method;
  Am_Object local_68 [3];
  undefined1 local_50 [8];
  am_rect r;
  Computed_Colors_Record color_rec;
  Am_Widget_Look look;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *menu_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  pAVar4 = Am_Object::Get(menu,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  iVar2 = iVar2 + x_offset;
  pAVar4 = Am_Object::Get(menu,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  iVar3 = iVar3 + y_offset;
  pAVar4 = Am_Object::Get(menu,0x66,0);
  w = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(menu,0x67,0);
  h = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(menu,0x17f,0);
  Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)((long)&color_rec.data + 4),pAVar4);
  pAVar4 = Am_Object::Get(menu,0x1ad,0);
  Computed_Colors_Record::Computed_Colors_Record((Computed_Colors_Record *)&r.width,pAVar4);
  am_rect::am_rect((am_rect *)local_50,iVar2,iVar3,w,h);
  if (color_rec.data._4_4_ == 0) {
    Am_Draw_Motif_Box(iVar2,iVar3,w,h,false,(Computed_Colors_Record *)&r.width,drawonable);
  }
  else if (color_rec.data._4_4_ == 1) {
    Am_Draw_Windows_Box(iVar2,iVar3,w,h,false,(Computed_Colors_Record *)&r.width,drawonable);
  }
  else {
    if (color_rec.data._4_4_ != 2) {
      Am_Error("Unknown Look parameter");
    }
    Am_Object::Am_Object(local_68,&Am_Menu_In_Scrolling_Menu);
    bVar1 = Am_Object::Is_Instance_Of(menu,local_68);
    Am_Object::~Am_Object(local_68);
    if (!bVar1) {
      Am_Object::Am_Object((Am_Object *)&method.Call,&Am_Menu_Bar);
      bVar1 = Am_Object::Is_Instance_Of(menu,(Am_Object *)&method.Call);
      Am_Object::~Am_Object((Am_Object *)&method.Call);
      if (bVar1) {
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_Black,&Am_White,(ulong)(local_50._0_4_ - 1),
                   (ulong)(local_50._4_4_ - 1),(ulong)(r.left + 2),CONCAT44(uVar6,r.top + 1),0);
      }
      else {
        uVar5 = CONCAT44(uVar6,r.top + -3);
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_Black,&Am_No_Style,(ulong)(local_50._0_4_ + 3),
                   (ulong)(local_50._4_4_ + 3),(ulong)(r.left - 3),uVar5,0);
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_Black,&Am_White,(ulong)(uint)local_50._0_4_,
                   (ulong)(uint)local_50._4_4_,(ulong)(r.left - 1),
                   CONCAT44((int)((ulong)uVar5 >> 0x20),r.top + -1),0);
      }
    }
  }
  Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)local_80);
  pAVar4 = Am_Object::Get(&Am_Aggregate,2000,0);
  Am_Draw_Method::operator=((Am_Draw_Method *)local_80,pAVar4);
  Am_Object::Am_Object(&local_88,menu);
  (*(code *)method.from_wrapper)(&local_88,drawonable,x_offset,y_offset);
  Am_Object::~Am_Object(&local_88);
  Computed_Colors_Record::~Computed_Colors_Record((Computed_Colors_Record *)&r.width);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, menu_draw,
                 (Am_Object menu, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)menu.Get(Am_LEFT) + x_offset;
  int top = (int)menu.Get(Am_TOP) + y_offset;
  int width = menu.Get(Am_WIDTH);
  int height = menu.Get(Am_HEIGHT);
  Am_Widget_Look look = menu.Get(Am_WIDGET_LOOK);
  Computed_Colors_Record color_rec = menu.Get(Am_STYLE_RECORD);

  am_rect r(left, top, width, height);

  // first draw the border
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    Am_Draw_Motif_Box(left, top, width, height, false, color_rec, drawonable);
    break;

  case Am_WINDOWS_LOOK_val: {
    Am_Draw_Windows_Box(left, top, width, height, false, color_rec, drawonable);
    break;
  }
  case Am_MACINTOSH_LOOK_val:
    if (menu.Is_Instance_Of(Am_Menu_In_Scrolling_Menu))
      ; //don't draw a background if in a scrolling menu
    else if (menu.Is_Instance_Of(Am_Menu_Bar)) // drawing menu bar
      drawonable->Draw_Rectangle(Am_Black, Am_White, r.left - 1, r.top - 1,
                                 r.width + 2, r.height + 1);
    else // drawing a menu
    {
      drawonable->Draw_Rectangle(Am_Black, Am_No_Style, r.left + 3, r.top + 3,
                                 r.width - 3, r.height - 3);
      drawonable->Draw_Rectangle(Am_Black, Am_White, r.left, r.top, r.width - 1,
                                 r.height - 1);
    }
    break;
  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  // now draw the graphical parts of the aggregate, using Am_Aggregate's
  // draw method.
  Am_Draw_Method method;
  method = Am_Aggregate.Get(Am_DRAW_METHOD);
  method.Call(menu, drawonable, x_offset, y_offset);
}